

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReorder.c
# Opt level: O2

void Abc_NtkBddReorder(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pNode;
  FILE *pFVar1;
  int nDdVarsMax;
  uint uVar2;
  reo_man *p;
  char *pcVar3;
  long lVar4;
  
  Abc_NtkRemoveDupFanins(pNtk);
  Abc_NtkMinimumBase(pNtk);
  nDdVarsMax = Abc_NtkGetFaninMax(pNtk);
  p = Extra_ReorderInit(nDdVarsMax,100);
  for (lVar4 = 0; pFVar1 = _stdout, lVar4 < pNtk->vObjs->nSize; lVar4 = lVar4 + 1) {
    pNode = (Abc_Obj_t *)pNtk->vObjs->pArray[lVar4];
    if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
       (2 < (pNode->vFanins).nSize)) {
      if (fVerbose == 0) {
        Abc_NodeBddReorder(p,pNode);
      }
      else {
        pcVar3 = Abc_ObjName(pNode);
        fprintf(pFVar1,"%10s: ",pcVar3);
        pFVar1 = _stdout;
        uVar2 = Cudd_DagSize((DdNode *)(pNode->field_5).pData);
        fprintf(pFVar1,"Before = %5d  BDD nodes.  ",(ulong)uVar2);
        Abc_NodeBddReorder(p,pNode);
        pFVar1 = _stdout;
        uVar2 = Cudd_DagSize((DdNode *)(pNode->field_5).pData);
        fprintf(pFVar1,"After = %5d  BDD nodes.\n",(ulong)uVar2);
      }
    }
  }
  Extra_ReorderQuit(p);
  return;
}

Assistant:

void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose )
{
    reo_man * p;
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    p = Extra_ReorderInit( Abc_NtkGetFaninMax(pNtk), 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) < 3 )
            continue;
        if ( fVerbose )
            fprintf( stdout, "%10s: ", Abc_ObjName(pNode) );
        if ( fVerbose )
            fprintf( stdout, "Before = %5d  BDD nodes.  ", Cudd_DagSize((DdNode *)pNode->pData) );
        Abc_NodeBddReorder( p, pNode );
        if ( fVerbose )
            fprintf( stdout, "After = %5d  BDD nodes.\n", Cudd_DagSize((DdNode *)pNode->pData) );
    }
    Extra_ReorderQuit( p );
}